

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void number_suite::output_int16(void)

{
  size_type sVar1;
  UI_STRING *uis;
  char *ui;
  undefined4 local_1e8;
  value local_1e4 [2];
  undefined1 local_1dc;
  undefined1 local_1db [43];
  error *ex_5;
  double result_6;
  error *ex_4;
  float result_5;
  error *ex_3;
  long result_4;
  error *ex_2;
  undefined4 local_108;
  int result_3;
  char *msg;
  short result_2;
  error *ex_1;
  char result_1;
  error *ex;
  bool result;
  undefined1 local_88 [8];
  reader reader;
  value_type input [3];
  
  reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._6_1_ = 1;
  reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._4_2_ = 0xb2;
  trial::protocol::bintoken::reader::reader<unsigned_char[3]>
            ((reader *)local_88,
             (uchar (*) [3])
             ((long)&reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x1c));
  sVar1 = trial::protocol::bintoken::reader::length((reader *)local_88);
  boost::detail::test_impl
            ("reader.length() == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x171,"void number_suite::output_int16()",sVar1 == 1);
  ex._3_1_ = std::numeric_limits<bool>::max();
  trial::protocol::bintoken::reader::array<bool>((reader *)local_88,(bool *)((long)&ex + 3),1);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.array(&result, 1)","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x175,"void number_suite::output_int16()");
  ex_1._6_1_ = std::numeric_limits<signed_char>::max();
  trial::protocol::bintoken::reader::array<signed_char>
            ((reader *)local_88,(char *)((long)&ex_1 + 6),1);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.array(&result, 1)","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x17a,"void number_suite::output_int16()");
  msg._4_2_ = std::numeric_limits<short>::max();
  trial::protocol::bintoken::reader::array<short>((reader *)local_88,(short *)((long)&msg + 4),1);
  local_108 = 0x100;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("result","INT16_C(0x0100)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x17f,"void number_suite::output_int16()",(long)&msg + 4,&local_108);
  ex_2._4_4_ = std::numeric_limits<int>::max();
  trial::protocol::bintoken::reader::array<int>((reader *)local_88,(int *)((long)&ex_2 + 4),1);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.array(&result, 1)","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x184,"void number_suite::output_int16()");
  ex_3 = (error *)std::numeric_limits<long>::max();
  trial::protocol::bintoken::reader::array<long>((reader *)local_88,(long *)&ex_3,1);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.array(&result, 1)","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x189,"void number_suite::output_int16()");
  ex_4._0_4_ = std::numeric_limits<float>::max();
  trial::protocol::bintoken::reader::array<float>((reader *)local_88,(float *)&ex_4,1);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.array(&result, 1)","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x18e,"void number_suite::output_int16()");
  ex_5 = (error *)std::numeric_limits<double>::max();
  trial::protocol::bintoken::reader::array<double>((reader *)local_88,(double *)&ex_5,1);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.array(&result, 1)","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x193,"void number_suite::output_int16()");
  local_1db[0] = trial::protocol::bintoken::reader::next((reader *)local_88);
  local_1dc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x195,"void number_suite::output_int16()",local_1db,&local_1dc);
  local_1e4[0] = trial::protocol::bintoken::reader::code((reader *)local_88);
  local_1e8 = 0;
  ui = "token::code::end";
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x196,"void number_suite::output_int16()",local_1e4,&local_1e8);
  trial::protocol::bintoken::reader::~reader((reader *)local_88,(UI *)ui,uis);
  return;
}

Assistant:

void output_int16()
{
    const value_type input[] = { token::code::int16, 0x00, 0x01 };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST(reader.length() == 1);
    {
        auto result = std::numeric_limits<token::boolean::type>::max();
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.array(&result, 1),
                                        format::error, "incompatible type");
    }
    {
        auto result = std::numeric_limits<token::int8::type>::max();
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.array(&result, 1),
                                        format::error, "invalid value");
    }
    {
        auto result = std::numeric_limits<token::int16::type>::max();
        TRIAL_PROTOCOL_TEST_NO_THROW(reader.array(&result, 1));
        TRIAL_PROTOCOL_TEST_EQUAL(result, INT16_C(0x0100));
    }
    {
        auto result = std::numeric_limits<token::int32::type>::max();
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.array(&result, 1),
                                        format::error, "invalid value");
    }
    {
        auto result = std::numeric_limits<token::int64::type>::max();
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.array(&result, 1),
                                        format::error, "invalid value");
    }
    {
        auto result = std::numeric_limits<token::float32::type>::max();
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.array(&result, 1),
                                        format::error, "invalid value");
    }
    {
        auto result = std::numeric_limits<token::float64::type>::max();
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.array(&result, 1),
                                        format::error, "invalid value");
    }
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}